

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

void ImGui::DrawRect(FloatRect *rect,Color *color,float rounding,int rounding_corners,
                    float thickness)

{
  ImU32 col;
  ImDrawList *this;
  ImVec4 local_60;
  ImVec4 local_50;
  ImVec2 local_40;
  ImVec2 local_38;
  ImDrawList *local_30;
  ImDrawList *draw_list;
  int local_20;
  float thickness_local;
  int rounding_corners_local;
  float rounding_local;
  Color *color_local;
  FloatRect *rect_local;
  
  draw_list._4_4_ = thickness;
  local_20 = rounding_corners;
  thickness_local = rounding;
  _rounding_corners_local = color;
  color_local = (Color *)rect;
  this = GetWindowDrawList();
  local_30 = this;
  local_38 = anon_unknown.dwarf_f6bf2::getTopLeftAbsolute((FloatRect *)color_local);
  local_40 = anon_unknown.dwarf_f6bf2::getDownRightAbsolute((FloatRect *)color_local);
  local_60 = (ImVec4)anon_unknown.dwarf_f6bf2::toImColor(*_rounding_corners_local);
  local_50 = ImColor::operator_cast_to_ImVec4((ImColor *)&local_60);
  col = ColorConvertFloat4ToU32(&local_50);
  ImDrawList::AddRect(this,&local_38,&local_40,col,thickness_local,local_20,draw_list._4_4_);
  return;
}

Assistant:

void DrawRect(const sf::FloatRect& rect, const sf::Color& color, float rounding,
              int rounding_corners, float thickness) {
    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    draw_list->AddRect(getTopLeftAbsolute(rect), getDownRightAbsolute(rect),
                       ColorConvertFloat4ToU32(toImColor(color)), rounding, rounding_corners,
                       thickness);
}